

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_index.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Index *pIVar1;
  int iVar2;
  Index *index;
  string index_file;
  Options options;
  Index *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [20];
  Options local_2c;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"testing kv index...",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"test.idx","");
  local_2c.page_type = kKeyPage;
  local_2c.mem_page_size = 0x1000;
  local_2c.mem_size = 0x100000;
  local_2c.disk_page_size = 0x20000;
  local_2c.bloom_filter_bit_per_key = 10;
  iVar2 = kvindex::Index::Open((string *)local_50,&local_2c,&local_78);
  if (iVar2 == 0) {
    testBasicPutGet(local_78);
    generateDataFile("test.data");
    pIVar1 = local_78;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"test.data","");
    (*(code *)**(undefined8 **)pIVar1)(pIVar1,local_70);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    testMemAndDiskPage(local_78);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"success",7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    return 0;
  }
  __assert_fail("kvindex::kOk == code",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lxyhcx[P]kv_index/test/test_index.cpp"
                ,0x56,"int main(int, char **)");
}

Assistant:

int main(int argc, char *argv[])
{
    cout << "testing kv index..." << endl;
    string index_file("test.idx");
    kvindex::Index* index;
    kvindex::Options options;
    kvindex::ErrorCode code = kvindex::Index::Open(index_file, options, &index);
    assert(kvindex::kOk == code);

    testBasicPutGet(index);

    generateDataFile("test.data");
    index->LoadDataFrom("test.data");

    // After load data from data file, test get some keys in data file,
    // including keys in mem pages and disk pages.
    testMemAndDiskPage(index);

    cout << "success" << endl;
    return 0;
}